

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

bool tinyxml2::XMLUtil::ToBool(char *str,bool *value)

{
  long lVar1;
  int iVar2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  char cVar6;
  bool bVar7;
  int ival;
  
  iVar2 = __isoc99_sscanf();
  if (iVar2 == 1) {
    bVar7 = false;
    goto LAB_0017605c;
  }
  bVar7 = true;
  pcVar4 = "true";
  if (str == "true") goto LAB_0017605c;
  cVar3 = *str;
  if (cVar3 != '\0') {
    lVar1 = 0;
    cVar6 = cVar3;
    do {
      lVar5 = lVar1;
      if ((cVar6 != "true"[lVar5]) || ((int)lVar5 == 0x7fffffff)) {
        if ((int)lVar5 != 0x7fffffff) goto LAB_00176008;
        goto LAB_0017605c;
      }
      cVar6 = str[lVar5 + 1];
      lVar1 = lVar5 + 1;
    } while (cVar6 != '\0');
    if ((int)(lVar5 + 1) == 0x7fffffff) goto LAB_0017605c;
    pcVar4 = "true" + lVar5 + 1;
  }
  if (*pcVar4 == '\0') goto LAB_0017605c;
LAB_00176008:
  pcVar4 = "false";
  if (str == "false") {
LAB_00176042:
    bVar7 = false;
  }
  else {
    if (cVar3 != '\0') {
      lVar1 = 0;
      do {
        lVar5 = lVar1;
        if ((cVar3 != "false"[lVar5]) || ((int)lVar5 == 0x7fffffff)) {
          bVar7 = false;
          if ((int)lVar5 != 0x7fffffff) {
            return false;
          }
          goto LAB_0017605c;
        }
        cVar3 = str[lVar5 + 1];
        lVar1 = lVar5 + 1;
      } while (cVar3 != '\0');
      if ((int)(lVar5 + 1) == 0x7fffffff) goto LAB_00176042;
      pcVar4 = "false" + lVar5 + 1;
    }
    bVar7 = false;
    if (*pcVar4 != '\0') {
      return false;
    }
  }
LAB_0017605c:
  *value = bVar7;
  return true;
}

Assistant:

bool XMLUtil::ToBool( const char* str, bool* value )
{
    int ival = 0;
    if ( ToInt( str, &ival )) {
        *value = (ival==0) ? false : true;
        return true;
    }
    if ( StringEqual( str, "true" ) ) {
        *value = true;
        return true;
    }
    else if ( StringEqual( str, "false" ) ) {
        *value = false;
        return true;
    }
    return false;
}